

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void jinit_master_decompress(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  my_master_ptr_conflict master;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x220);
  *puVar1 = prepare_for_output_pass;
  puVar1[1] = finish_output_pass;
  *(undefined4 *)(puVar1 + 2) = 0;
  *(undefined4 *)((long)puVar1 + 0x6c) = 0;
  master_selection(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_master_decompress(j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr)cinfo->master;

  master->pub.prepare_for_output_pass = prepare_for_output_pass;
  master->pub.finish_output_pass = finish_output_pass;

  master->pub.is_dummy_pass = FALSE;
  master->pub.jinit_upsampler_no_alloc = FALSE;

  master_selection(cinfo);
}